

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinger.c
# Opt level: O1

Pinger * pinger_new(Conf *conf,Backend *backend)

{
  int iVar1;
  Pinger *pinger;
  
  pinger = (Pinger *)safemalloc(1,0x20,0);
  iVar1 = conf_get_int(conf,6);
  pinger->interval = iVar1;
  pinger->pending = false;
  pinger->backend = backend;
  pinger_schedule(pinger);
  return pinger;
}

Assistant:

Pinger *pinger_new(Conf *conf, Backend *backend)
{
    Pinger *pinger = snew(Pinger);

    pinger->interval = conf_get_int(conf, CONF_ping_interval);
    pinger->pending = false;
    pinger->backend = backend;
    pinger_schedule(pinger);

    return pinger;
}